

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
TestStreamWriterTestdropNullPlaceholders::runTestCase
          (TestStreamWriterTestdropNullPlaceholders *this)

{
  int iVar1;
  Value *pVVar2;
  char *in_RCX;
  Value nullValue;
  StreamWriterBuilder b;
  string local_e8;
  Value local_c8;
  StreamWriterBuilder local_a0;
  Value local_70;
  Value local_48;
  
  Json::StreamWriterBuilder::StreamWriterBuilder(&local_a0);
  Json::Value::Value(&local_c8,nullValue);
  Json::Value::Value(&local_48,false);
  pVVar2 = Json::Value::operator[](&local_a0.settings_,"dropNullPlaceholders");
  Json::Value::operator=(pVVar2,&local_48);
  Json::Value::~Value(&local_48);
  Json::writeString_abi_cxx11_(&local_e8,(Json *)&local_a0,(Factory *)&local_c8,(Value *)in_RCX);
  iVar1 = std::__cxx11::string::compare((char *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (iVar1 != 0) {
    in_RCX = "Json::writeString(b, nullValue) == \"null\"";
    JsonTest::TestResult::addFailure
              ((this->super_StreamWriterTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x679,"Json::writeString(b, nullValue) == \"null\"");
  }
  Json::Value::Value(&local_70,true);
  pVVar2 = Json::Value::operator[](&local_a0.settings_,"dropNullPlaceholders");
  Json::Value::operator=(pVVar2,&local_70);
  Json::Value::~Value(&local_70);
  Json::writeString_abi_cxx11_(&local_e8,(Json *)&local_a0,(Factory *)&local_c8,(Value *)in_RCX);
  iVar1 = std::__cxx11::string::compare((char *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (iVar1 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_StreamWriterTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x67b,"Json::writeString(b, nullValue) == \"\"");
  }
  Json::Value::~Value(&local_c8);
  Json::StreamWriterBuilder::~StreamWriterBuilder(&local_a0);
  return;
}

Assistant:

JSONTEST_FIXTURE(StreamWriterTest, dropNullPlaceholders) {
  Json::StreamWriterBuilder b;
  Json::Value nullValue;
  b.settings_["dropNullPlaceholders"] = false;
  JSONTEST_ASSERT(Json::writeString(b, nullValue) == "null");
  b.settings_["dropNullPlaceholders"] = true;
  JSONTEST_ASSERT(Json::writeString(b, nullValue) == "");
}